

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Track::Seek(Track *this,longlong time_ns,BlockEntry **pResult)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  Cluster *pCVar4;
  long lVar5;
  undefined4 extraout_var;
  longlong lVar6;
  unsigned_long uVar7;
  Cluster **ppCVar8;
  Cluster **ppCVar9;
  BlockEntry *pBVar10;
  Cluster **ppCVar11;
  longlong t;
  Cluster **mid;
  Cluster **hi;
  Cluster **lo;
  Cluster **j;
  Cluster **i;
  long count;
  Cluster **clusters;
  Cluster *pCluster;
  long status;
  BlockEntry **pResult_local;
  longlong time_ns_local;
  Track *this_local;
  
  this_local = (Track *)GetFirst(this,pResult);
  if (-1 < (long)this_local) {
    if (*pResult == (BlockEntry *)0x0) {
      __assert_fail("pResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x12e0,
                    "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
    }
    bVar2 = BlockEntry::EOS(*pResult);
    if (bVar2) {
      this_local = (Track *)0x0;
    }
    else {
      pCVar4 = BlockEntry::GetCluster(*pResult);
      if (pCVar4 == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x12e6,
                      "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
      }
      lVar5 = Cluster::GetIndex(pCVar4);
      if (lVar5 < 0) {
        __assert_fail("pCluster->GetIndex() >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x12e7,
                      "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
      }
      iVar3 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar6 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar3),pCVar4);
      if (lVar6 < time_ns) {
        ppCVar11 = this->m_pSegment->m_clusters;
        if (ppCVar11 == (Cluster **)0x0) {
          __assert_fail("clusters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12ed,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        uVar7 = Segment::GetCount(this->m_pSegment);
        if ((long)uVar7 < 1) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f0,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar5 = Cluster::GetIndex(pCVar4);
        ppCVar8 = ppCVar11 + lVar5;
        if (ppCVar8 == (Cluster **)0x0) {
          __assert_fail("i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f3,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (*ppCVar8 != pCVar4) {
          __assert_fail("*i == pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f4,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar6 = Cluster::GetTime(pCVar4);
        if (time_ns < lVar6) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f5,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        mid = ppCVar11 + uVar7;
        hi = ppCVar8;
        while (hi < mid) {
          auVar1._8_8_ = (long)mid - (long)hi >> 0x3f;
          auVar1._0_8_ = (long)mid - (long)hi >> 3;
          ppCVar9 = hi + SUB168(auVar1 / SEXT816(2),0);
          if (mid <= ppCVar9) {
            __assert_fail("mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1303,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pCVar4 = *ppCVar9;
          if (pCVar4 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1306,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar5 = Cluster::GetIndex(pCVar4);
          if (lVar5 < 0) {
            __assert_fail("pCluster->GetIndex() >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1307,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar5 = Cluster::GetIndex(pCVar4);
          if (lVar5 != (long)ppCVar9 - (long)this->m_pSegment->m_clusters >> 3) {
            __assert_fail("pCluster->GetIndex() == long(mid - m_pSegment->m_clusters)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1308,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar6 = Cluster::GetTime(pCVar4);
          if (lVar6 <= time_ns) {
            hi = ppCVar9 + 1;
            ppCVar9 = mid;
          }
          mid = ppCVar9;
          if (mid < hi) {
            __assert_fail("lo <= hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1311,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
        }
        if (hi != mid) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1314,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (hi <= ppCVar8) {
          __assert_fail("lo > i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1315,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (ppCVar11 + uVar7 < hi) {
          __assert_fail("lo <= j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1316,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        do {
          if (hi <= ppCVar8) {
            pBVar10 = GetEOS(this);
            *pResult = pBVar10;
            return 0;
          }
          ppCVar11 = hi + -1;
          pCVar4 = hi[-1];
          if (pCVar4 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x131a,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar6 = Cluster::GetTime(pCVar4);
          if (time_ns < lVar6) {
            __assert_fail("pCluster->GetTime() <= time_ns",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x131b,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pBVar10 = Cluster::GetEntry(pCVar4,this,-1);
          *pResult = pBVar10;
          hi = ppCVar11;
        } while ((*pResult == (BlockEntry *)0x0) || (bVar2 = BlockEntry::EOS(*pResult), bVar2));
        this_local = (Track *)0x0;
      }
      else {
        this_local = (Track *)0x0;
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Track::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not preloaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  while (lo > i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this);

    if ((pResult != 0) && !pResult->EOS())
      return 0;

    // landed on empty cluster (no entries)
  }

  pResult = GetEOS();  // weird
  return 0;
}